

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

int __thiscall Catch::Session::applyCommandLine(Session *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Context *this_00;
  Config *config;
  IStream *pIVar3;
  undefined4 extraout_var;
  ColourImpl *pCVar4;
  ostream *poVar5;
  string *text;
  Column *col;
  undefined4 extraout_var_00;
  Column local_150;
  ColourGuard local_118;
  unique_ptr<Catch::ColourImpl> local_108;
  unique_ptr<Catch::ColourImpl> colour;
  string local_f8;
  unique_ptr<Catch::IStream> local_d8;
  unique_ptr<Catch::IStream> errStream;
  Args local_c0;
  undefined1 local_88 [8];
  InternalParseResult result;
  char **argv_local;
  int argc_local;
  Session *this_local;
  
  if ((this->m_startupExceptions & 1U) == 0) {
    result.m_errorMessage.field_2._8_8_ = argv;
    Clara::Args::Args(&local_c0,argc,argv);
    Clara::Detail::ParserBase::parse((InternalParseResult *)local_88,(ParserBase *)this,&local_c0);
    Clara::Args::~Args(&local_c0);
    bVar1 = Clara::Detail::BasicResult::operator_cast_to_bool((BasicResult *)local_88);
    if (bVar1) {
      if (((this->m_configData).showHelp & 1U) != 0) {
        showHelp(this);
      }
      if (((this->m_configData).libIdentify & 1U) != 0) {
        libIdentify(this);
      }
      Detail::unique_ptr<Catch::Config>::reset(&this->m_config,(Config *)0x0);
      this_local._4_4_ = 0;
    }
    else {
      Session::config(this);
      this_00 = getCurrentMutableContext();
      config = Detail::unique_ptr<Catch::Config>::get(&this->m_config);
      Context::setConfig(this_00,&config->super_IConfig);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"%stderr",(allocator<char> *)((long)&colour.m_ptr + 7));
      makeStream((Catch *)&local_d8,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&colour.m_ptr + 7));
      pIVar3 = Detail::unique_ptr<Catch::IStream>::get(&local_d8);
      makeColourImpl((Catch *)&local_108,PlatformDefault,pIVar3);
      pIVar3 = Detail::unique_ptr<Catch::IStream>::operator->(&local_d8);
      iVar2 = (*pIVar3->_vptr_IStream[2])();
      pCVar4 = Detail::unique_ptr<Catch::ColourImpl>::operator->(&local_108);
      ColourImpl::guardColour((ColourImpl *)&local_118,(Code)pCVar4);
      poVar5 = Catch::operator<<((ostream *)CONCAT44(extraout_var,iVar2),&local_118);
      poVar5 = std::operator<<(poVar5,"\nError(s) in input:\n");
      text = Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::errorMessage_abi_cxx11_
                       ((BasicResult<Catch::Clara::Detail::ParseState> *)local_88);
      TextFlow::Column::Column(&local_150,text);
      col = TextFlow::Column::indent(&local_150,2);
      poVar5 = TextFlow::operator<<(poVar5,col);
      std::operator<<(poVar5,"\n\n");
      TextFlow::Column::~Column(&local_150);
      ColourImpl::ColourGuard::~ColourGuard(&local_118);
      pIVar3 = Detail::unique_ptr<Catch::IStream>::operator->(&local_d8);
      iVar2 = (*pIVar3->_vptr_IStream[2])();
      poVar5 = std::operator<<((ostream *)CONCAT44(extraout_var_00,iVar2),
                               "Run with -? for usage\n\n");
      std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
      this_local._4_4_ = 0xff;
      Detail::unique_ptr<Catch::ColourImpl>::~unique_ptr(&local_108);
      Detail::unique_ptr<Catch::IStream>::~unique_ptr(&local_d8);
    }
    Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::~BasicResult
              ((BasicResult<Catch::Clara::Detail::ParseState> *)local_88);
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Session::applyCommandLine( int argc, char const * const * argv ) {
        if( m_startupExceptions )
            return 1;

        auto result = m_cli.parse( Clara::Args( argc, argv ) );

        if( !result ) {
            config();
            getCurrentMutableContext().setConfig(m_config.get());
            auto errStream = makeStream( "%stderr" );
            auto colour = makeColourImpl( ColourMode::PlatformDefault, errStream.get() );

            errStream->stream()
                << colour->guardColour( Colour::Red )
                << "\nError(s) in input:\n"
                << TextFlow::Column( result.errorMessage() ).indent( 2 )
                << "\n\n";
            errStream->stream() << "Run with -? for usage\n\n" << std::flush;
            return MaxExitCode;
        }

        if( m_configData.showHelp )
            showHelp();
        if( m_configData.libIdentify )
            libIdentify();

        m_config.reset();
        return 0;
    }